

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printArray(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  Value *this_00;
  size_t sVar2;
  ulong local_28;
  size_t i;
  Ref args;
  JSPrinter *this_local;
  Ref node_local;
  
  args.inst = (Value *)this;
  this_local = (JSPrinter *)node.inst;
  emit(this,'[');
  pRVar1 = Ref::operator[]((Ref *)&this_local,1);
  i = (size_t)pRVar1->inst;
  local_28 = 0;
  while( true ) {
    this_00 = Ref::operator->((Ref *)&i);
    sVar2 = cashew::Value::size(this_00);
    if (sVar2 <= local_28) break;
    if (local_28 != 0) {
      if ((this->pretty & 1U) == 0) {
        emit(this,',');
      }
      else {
        emit(this,", ");
      }
    }
    pRVar1 = Ref::operator[]((Ref *)&i,(uint)local_28);
    print(this,pRVar1->inst);
    local_28 = local_28 + 1;
  }
  emit(this,']');
  return;
}

Assistant:

void printArray(Ref node) {
    emit('[');
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      print(args[i]);
    }
    emit(']');
  }